

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMan.c
# Opt level: O0

Hop_Man_t * Hop_ManStart(void)

{
  Hop_Man_t *p_00;
  Vec_Ptr_t *pVVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t **ppHVar3;
  Hop_Man_t *p;
  
  p_00 = (Hop_Man_t *)malloc(0xb8);
  memset(p_00,0,0xb8);
  p_00->nTravIds = 1;
  p_00->fRefCount = 1;
  p_00->fCatchExor = 0;
  pVVar1 = Vec_PtrAlloc(100);
  p_00->vPis = pVVar1;
  pVVar1 = Vec_PtrAlloc(100);
  p_00->vPos = pVVar1;
  Hop_ManStartMemory(p_00);
  pHVar2 = Hop_ManFetchMemory(p_00);
  p_00->pConst1 = pHVar2;
  *(uint *)&p_00->pConst1->field_0x20 = *(uint *)&p_00->pConst1->field_0x20 & 0xfffffff8 | 1;
  *(uint *)&p_00->pConst1->field_0x20 = *(uint *)&p_00->pConst1->field_0x20 & 0xfffffff7 | 8;
  p_00->nCreated = 1;
  p_00->nTableSize = 0x2717;
  ppHVar3 = (Hop_Obj_t **)malloc((long)p_00->nTableSize << 3);
  p_00->pTable = ppHVar3;
  memset(p_00->pTable,0,(long)p_00->nTableSize << 3);
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Hop_Man_t * Hop_ManStart()
{
    Hop_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Hop_Man_t, 1 );
    memset( p, 0, sizeof(Hop_Man_t) );
    // perform initializations
    p->nTravIds = 1;
    p->fRefCount = 1;
    p->fCatchExor = 0;
    // allocate arrays for nodes
    p->vPis = Vec_PtrAlloc( 100 );
    p->vPos = Vec_PtrAlloc( 100 );
    // prepare the internal memory manager
    Hop_ManStartMemory( p );
    // create the constant node
    p->pConst1 = Hop_ManFetchMemory( p );
    p->pConst1->Type = AIG_CONST1;
    p->pConst1->fPhase = 1;
    p->nCreated = 1;
    // start the table
//    p->nTableSize = 107;
    p->nTableSize = 10007;
    p->pTable = ABC_ALLOC( Hop_Obj_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Hop_Obj_t *) * p->nTableSize );
    return p;
}